

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate1<std::complex<float>_>::apply
          (QGate1<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  SquareMatrix<std::complex<float>_> *mat1;
  undefined4 in_register_00000084;
  SquareMatrix<std::complex<float>_> local_60;
  undefined1 local_50 [8];
  anon_class_40_5_d6c92a71_conflict f;
  int qubit;
  int offset_local;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  QGate1<std::complex<float>_> *this_local;
  
  f.m22._M_value._4_4_ = offset;
  iVar1 = (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
  f.m22._M_value._0_4_ = iVar1 + f.m22._M_value._4_4_;
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])();
  mat1 = (SquareMatrix<std::complex<float>_> *)
         std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::data(vector);
  lambda_QGate1<std::complex<float>>
            ((anon_class_40_5_d6c92a71_conflict *)local_50,(qgates *)(ulong)(uint)(int)(char)op,
             (Op)&local_60,mat1,(complex<float> *)CONCAT44(in_register_00000084,offset));
  dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_60);
  apply2<qclab::qgates::lambda_QGate1<std::complex<float>>(qclab::Op,qclab::dense::SquareMatrix<std::complex<float>>,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,(int)f.m22._M_value,(anon_class_40_5_d6c92a71_conflict *)local_50);
  return;
}

Assistant:

void QGate1< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_QGate1( op , this->matrix() , vector.data() ) ;
    apply2( nbQubits , qubit , f ) ;
  }